

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TablePrinter.hpp
# Opt level: O1

void __thiscall trl::TablePrinter::PrintHeader(TablePrinter *this)

{
  ostream *poVar1;
  pointer piVar2;
  undefined8 uVar3;
  long lVar4;
  pointer pbVar5;
  uint uVar6;
  ulong uVar7;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  PrintHorizontalLine(this,'=');
  std::__ostream_insert<char,std::char_traits<char>>(this->m_outStream,"|",1);
  pbVar5 = (this->m_columnTitles).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_columnTitles).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) >> 5)) {
    lVar4 = 0;
    uVar7 = 0;
    do {
      poVar1 = this->m_outStream;
      uVar6 = 0x80;
      if (this->m_flushLeft != false) {
        uVar6 = 0x20;
      }
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           uVar6 | *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffff4f;
      piVar2 = (this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->m_columnWidths).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar7) {
LAB_00102a69:
        uVar3 = std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar7);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        _Unwind_Resume(uVar3);
      }
      poVar1 = this->m_outStream;
      *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)piVar2[uVar7];
      if ((ulong)((long)(this->m_columnTitles).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) <= uVar7)
      goto LAB_00102a69;
      std::__cxx11::string::substr((ulong)&local_50,(long)&(pbVar5->_M_dataplus)._M_p + lVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if (uVar7 != (int)((ulong)((long)(this->m_columnTitles).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_columnTitles).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5) - 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->m_outStream,(this->m_columnSeparator)._M_dataplus._M_p,
                   (this->m_columnSeparator)._M_string_length);
      }
      uVar7 = uVar7 + 1;
      pbVar5 = (this->m_columnTitles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x20;
    } while ((long)uVar7 <
             (long)(int)((ulong)((long)(this->m_columnTitles).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) >>
                        5));
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->m_outStream,"|\n",2);
  PrintHorizontalLine(this,'=');
  return;
}

Assistant:

void PrintHeader() {

            PrintHorizontalLine('=');
            m_outStream << "|";

            for (int i = 0; i < GetColumnCount(); ++i) {

                if (m_flushLeft)
                    m_outStream << std::left;
                else
                    m_outStream << std::right;

                m_outStream << std::setw(m_columnWidths.at(i)) << m_columnTitles.at(i).substr(0, m_columnWidths.at(i));
                if (i != GetColumnCount() - 1) {
                    m_outStream << m_columnSeparator;
                }
            }

            m_outStream << "|\n";
            PrintHorizontalLine('=');
        }